

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::check_invariants(Solver *this)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  uint32_t uVar4;
  int iVar5;
  Lit *pLVar6;
  int *piVar7;
  ostream *poVar8;
  uint *puVar9;
  Watcher *pWVar10;
  char *pcVar11;
  void *this_00;
  vec<unsigned_int> *this_01;
  long in_RDI;
  Clause *c_3;
  CRef old_reason;
  Lit old_trail_top;
  int i_2;
  CRef inner_cr_1;
  int k_1;
  Clause *c_2;
  CRef wcr_3;
  int j_5;
  vec<Minisat::Watcher> *ws_bin;
  CRef inner_cr;
  int k;
  Clause *c_1;
  CRef wcr_2;
  int j_4;
  vec<Minisat::Watcher> *ws_2;
  Lit l_3;
  int p_1;
  Var v_1;
  CRef wcr_1;
  int j_3;
  int didFind_1;
  vec<Minisat::Watcher> *ws_1;
  Lit l_2;
  int j_2;
  CRef wcr;
  int j_1;
  int didFind;
  vec<Minisat::Watcher> *ws;
  Lit l_1;
  int j;
  Clause *c;
  CRef cr;
  int i_1;
  vec<unsigned_int> *clause_list;
  int p;
  int l;
  Var v;
  int i;
  bool fatal_on_watch_removed;
  bool pass;
  Ref in_stack_fffffffffffffe6c;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  Clause *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  ostream *in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  bool local_161;
  vec<unsigned_int> *local_148;
  vec<unsigned_int> *local_140;
  vec<unsigned_int> *local_138;
  Lit local_114;
  Clause *local_110;
  int local_108;
  uint local_104;
  Lit local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  Lit local_f0;
  int local_ec;
  int local_e8;
  Lit local_e4;
  CRef local_e0;
  int local_dc;
  Clause *local_d8;
  CRef local_d0;
  int local_cc;
  vec<Minisat::Watcher> *local_c8;
  int local_c0;
  int local_bc;
  Lit local_b8;
  int local_b4;
  int local_b0;
  Lit local_ac;
  CRef local_a8;
  int local_a4;
  Clause *local_a0;
  CRef local_98;
  int local_94;
  vec<Minisat::Watcher> *local_90;
  Lit local_88;
  int local_84;
  int local_80;
  uint local_7c;
  int local_78;
  int local_74;
  vec<Minisat::Watcher> *local_70;
  int local_68;
  int local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  vec<Minisat::Watcher> *local_50;
  int local_44;
  int local_40;
  int local_3c;
  Clause *local_38;
  uint local_30;
  int local_2c;
  vec<unsigned_int> *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = 1;
  local_a = 0;
  for (local_10 = 0; iVar5 = local_10,
      iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350)), iVar5 < iVar2;
      local_10 = local_10 + 1) {
    pLVar6 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),local_10);
    local_18 = pLVar6->x;
    local_14 = var((Lit)local_18);
    local_1c = level((Solver *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
    if (((local_1c != 0) &&
        (CVar3 = reason((Solver *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                        in_stack_fffffffffffffe6c), CVar3 == 0xffffffff)) &&
       (piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x360),local_1c + -1),
       *piVar7 != local_10)) {
      std::operator<<((ostream *)&std::cout,"c trail literal ");
      vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),local_10);
      poVar8 = operator<<((ostream *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (Lit *)in_stack_fffffffffffffe88);
      poVar8 = std::operator<<(poVar8," at level ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c);
      poVar8 = std::operator<<(poVar8," (pos: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_10);
      poVar8 = std::operator<<(poVar8," has no proper reason clause");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_9 = 0;
    }
  }
  local_20 = 0;
  do {
    if (3 < local_20) {
      for (local_80 = 0; iVar5 = local_80, iVar2 = nVars((Solver *)0x137ae1), iVar5 < iVar2;
          local_80 = local_80 + 1) {
        for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
          local_88 = mkLit(local_80,local_84 == 1);
          local_90 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                     ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                   *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (Lit *)in_stack_fffffffffffffe78);
          for (local_94 = 0; iVar5 = local_94, iVar2 = vec<Minisat::Watcher>::size(local_90),
              iVar5 < iVar2; local_94 = local_94 + 1) {
            pWVar10 = vec<Minisat::Watcher>::operator[](local_90,local_94);
            local_98 = pWVar10->cref;
            local_a0 = ClauseAllocator::operator[]
                                 ((ClauseAllocator *)
                                  CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
            local_a4 = local_94;
            while( true ) {
              local_a4 = local_a4 + 1;
              iVar5 = local_a4;
              iVar2 = vec<Minisat::Watcher>::size(local_90);
              if (iVar2 <= iVar5) break;
              pWVar10 = vec<Minisat::Watcher>::operator[](local_90,local_a4);
              local_a8 = pWVar10->cref;
              if (local_a8 == local_98) {
                poVar8 = std::operator<<((ostream *)&std::cout,"c found clause [");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_98);
                std::operator<<(poVar8,"] ");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                    in_stack_fffffffffffffe78);
                std::operator<<(poVar8," multiple times in watch lists of literal ");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (Lit *)in_stack_fffffffffffffe88);
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                if ((local_a & 1) != 0) {
                  local_9 = 0;
                }
              }
            }
            uVar4 = Clause::mark(local_a0);
            if (uVar4 == 1) {
              poVar8 = std::operator<<((ostream *)&std::cout,"c found deleted clause [");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_98);
              std::operator<<(poVar8,"]");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78);
              std::operator<<(poVar8," in watch lists of literal ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (Lit *)in_stack_fffffffffffffe88);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              if ((local_a & 1) != 0) {
                local_9 = 0;
              }
            }
            iVar5 = Clause::size(local_a0);
            if (iVar5 < 3) {
              poVar8 = std::operator<<((ostream *)&std::cout,"c found binary or smaller clause [");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_98);
              std::operator<<(poVar8,"]");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78);
              std::operator<<(poVar8," in watch list of literal ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (Lit *)in_stack_fffffffffffffe88);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              local_9 = 0;
            }
            local_ac = Clause::operator[](local_a0,0);
            local_b4 = local_88.x;
            local_b0 = (int)operator~(local_88);
            bVar1 = Lit::operator!=(&local_ac,(Lit)local_b0);
            local_161 = false;
            if (bVar1) {
              local_b8 = Clause::operator[](local_a0,1);
              local_c0 = local_88.x;
              local_bc = (int)operator~(local_88);
              local_161 = Lit::operator!=(&local_b8,(Lit)local_bc);
            }
            if (local_161 != false) {
              poVar8 = std::operator<<((ostream *)&std::cout,"c wrong literals for clause [");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_98);
              std::operator<<(poVar8,"] ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78);
              std::operator<<(poVar8," are watched. Found in list for ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (Lit *)in_stack_fffffffffffffe88);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              local_9 = 0;
            }
          }
          local_c8 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                     ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                   *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (Lit *)in_stack_fffffffffffffe78);
          for (local_cc = 0; iVar5 = local_cc, iVar2 = vec<Minisat::Watcher>::size(local_c8),
              iVar5 < iVar2; local_cc = local_cc + 1) {
            pWVar10 = vec<Minisat::Watcher>::operator[](local_c8,local_cc);
            local_d0 = pWVar10->cref;
            local_d8 = ClauseAllocator::operator[]
                                 ((ClauseAllocator *)
                                  CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
            local_dc = local_cc;
            while( true ) {
              local_dc = local_dc + 1;
              in_stack_fffffffffffffe94 = local_dc;
              iVar5 = vec<Minisat::Watcher>::size(local_c8);
              if (iVar5 <= in_stack_fffffffffffffe94) break;
              pWVar10 = vec<Minisat::Watcher>::operator[](local_c8,local_dc);
              local_e0 = pWVar10->cref;
              if (local_e0 == local_d0) {
                poVar8 = std::operator<<((ostream *)&std::cout,"c found clause [");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_d0);
                std::operator<<(poVar8,"] ");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                    in_stack_fffffffffffffe78);
                std::operator<<(poVar8," multiple times in watch lists of literal ");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (Lit *)in_stack_fffffffffffffe88);
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                if ((local_a & 1) != 0) {
                  local_9 = 0;
                }
              }
            }
            uVar4 = Clause::mark(local_d8);
            if (uVar4 == 1) {
              poVar8 = std::operator<<((ostream *)&std::cout,"c found deleted clause [");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_d0);
              std::operator<<(poVar8,"]");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78);
              std::operator<<(poVar8," in watch lists of literal ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (Lit *)in_stack_fffffffffffffe88);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              if ((local_a & 1) != 0) {
                local_9 = 0;
              }
            }
            iVar5 = Clause::size(local_d8);
            if (iVar5 != 2) {
              poVar8 = std::operator<<((ostream *)&std::cout,"c found non-binary clause [");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_d0);
              std::operator<<(poVar8,"]");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78);
              std::operator<<(poVar8," in binary watch list of literal ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (Lit *)in_stack_fffffffffffffe88);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              local_9 = 0;
            }
            local_e4 = Clause::operator[](local_d8,0);
            local_ec = local_88.x;
            local_e8 = (int)operator~(local_88);
            bVar1 = Lit::operator!=(&local_e4,(Lit)local_e8);
            in_stack_fffffffffffffe90 = in_stack_fffffffffffffe90 & 0xffffff;
            if (bVar1) {
              local_f0 = Clause::operator[](local_d8,1);
              local_f8 = local_88.x;
              local_f4 = (int)operator~(local_88);
              bVar1 = Lit::operator!=(&local_f0,(Lit)local_f4);
              in_stack_fffffffffffffe90 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe90);
            }
            if ((char)(in_stack_fffffffffffffe90 >> 0x18) != '\0') {
              poVar8 = std::operator<<((ostream *)&std::cout,"c wrong literals for clause [");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_d0);
              std::operator<<(poVar8,"] ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78);
              std::operator<<(poVar8," are watched. Found in list for ");
              poVar8 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (Lit *)in_stack_fffffffffffffe88);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              local_9 = 0;
            }
          }
        }
        pcVar11 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),local_80);
        if (*pcVar11 != '\0') {
          poVar8 = std::operator<<((ostream *)&std::cout,"c seen for variable ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_80);
          in_stack_fffffffffffffe88 = std::operator<<(poVar8," is not 0, but ");
          pcVar11 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),local_80);
          this_00 = (void *)std::ostream::operator<<(in_stack_fffffffffffffe88,(int)*pcVar11);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          local_9 = 0;
        }
      }
      local_fc = 0;
      while (iVar5 = local_fc,
            iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x390)), iVar5 < iVar2) {
        pLVar6 = vec<Minisat::Lit>::operator[]
                           ((vec<Minisat::Lit> *)(in_RDI + 0x390),*(int *)(in_RDI + 0x388));
        local_108 = pLVar6->x;
        this_01 = (vec<unsigned_int> *)(in_RDI + 0x3a0);
        local_100.x = local_108;
        iVar5 = var((Lit)local_108);
        puVar9 = vec<unsigned_int>::operator[](this_01,iVar5);
        local_104 = *puVar9;
        if (local_104 != 0xffffffff) {
          local_110 = ClauseAllocator::operator[]
                                ((ClauseAllocator *)
                                 CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                                 in_stack_fffffffffffffe6c);
          iVar5 = Clause::size(local_110);
          in_stack_fffffffffffffe77 = true;
          if (iVar5 != 2) {
            local_114 = Clause::operator[](local_110,0);
            in_stack_fffffffffffffe77 = Lit::operator==(&local_114,local_100);
          }
          if (((in_stack_fffffffffffffe77 ^ 0xff) & 1) != 0) {
            local_9 = 0;
          }
        }
        local_fc = local_fc + 1;
      }
      return (bool)(local_9 & 1);
    }
    if (local_20 == 0) {
      local_138 = (vec<unsigned_int> *)(in_RDI + 0x230);
    }
    else {
      if (local_20 == 1) {
        local_140 = (vec<unsigned_int> *)(in_RDI + 0x240);
      }
      else {
        if (local_20 == 2) {
          local_148 = (vec<unsigned_int> *)(in_RDI + 0x250);
        }
        else {
          local_148 = (vec<unsigned_int> *)(in_RDI + 0x260);
        }
        local_140 = local_148;
      }
      local_138 = local_140;
    }
    local_28 = local_138;
    for (local_2c = 0; iVar5 = local_2c, iVar2 = vec<unsigned_int>::size(local_28), iVar5 < iVar2;
        local_2c = local_2c + 1) {
      puVar9 = vec<unsigned_int>::operator[](local_28,local_2c);
      local_30 = *puVar9;
      local_38 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)
                            CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe6c);
      uVar4 = Clause::mark(local_38);
      if (uVar4 != 1) {
        iVar5 = Clause::size(local_38);
        if (iVar5 == 1) {
          poVar8 = std::operator<<((ostream *)&std::cout,"c there should not be unit clauses! [");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_30);
          std::operator<<(poVar8,"]");
          poVar8 = operator<<((ostream *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe78);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          local_9 = 0;
        }
        else {
          iVar5 = Clause::size(local_38);
          if (iVar5 < 3) {
            for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
              local_68 = (int)Clause::operator[](local_38,local_60);
              local_64 = (int)operator~((Lit)local_68);
              local_70 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                         ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                       *)CONCAT44(in_stack_fffffffffffffe84,
                                                  in_stack_fffffffffffffe80),
                                      (Lit *)in_stack_fffffffffffffe78);
              local_74 = 0;
              for (local_78 = 0; iVar5 = local_78, iVar2 = vec<Minisat::Watcher>::size(local_70),
                  iVar5 < iVar2; local_78 = local_78 + 1) {
                pWVar10 = vec<Minisat::Watcher>::operator[](local_70,local_78);
                local_7c = pWVar10->cref;
                if (local_7c == local_30) {
                  local_74 = local_74 + 1;
                  break;
                }
              }
              if (local_74 != 1) {
                poVar8 = std::operator<<((ostream *)&std::cout,"c could not find clause[");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_30);
                std::operator<<(poVar8,"] ");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                    in_stack_fffffffffffffe78);
                poVar8 = std::operator<<(poVar8," in watcher for lit [");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_60);
                std::operator<<(poVar8,"]");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (Lit *)in_stack_fffffffffffffe88);
                poVar8 = std::operator<<(poVar8," 1 time, but ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_74);
                poVar8 = std::operator<<(poVar8," times");
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                local_9 = 0;
              }
            }
          }
          else {
            for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
              local_44 = (int)Clause::operator[](local_38,local_3c);
              local_40 = (int)operator~((Lit)local_44);
              local_50 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                         ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                       *)CONCAT44(in_stack_fffffffffffffe84,
                                                  in_stack_fffffffffffffe80),
                                      (Lit *)in_stack_fffffffffffffe78);
              local_54 = 0;
              for (local_58 = 0; iVar5 = local_58, iVar2 = vec<Minisat::Watcher>::size(local_50),
                  iVar5 < iVar2; local_58 = local_58 + 1) {
                pWVar10 = vec<Minisat::Watcher>::operator[](local_50,local_58);
                local_5c = pWVar10->cref;
                if (local_5c == local_30) {
                  local_54 = local_54 + 1;
                  break;
                }
              }
              if (local_54 != 1) {
                poVar8 = std::operator<<((ostream *)&std::cout,"c could not find clause[");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_30);
                std::operator<<(poVar8,"] ");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                    in_stack_fffffffffffffe78);
                poVar8 = std::operator<<(poVar8," in watcher for lit [");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_3c);
                std::operator<<(poVar8,"]");
                poVar8 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (Lit *)in_stack_fffffffffffffe88);
                poVar8 = std::operator<<(poVar8," 1 time, but ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_54);
                poVar8 = std::operator<<(poVar8," times");
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                local_9 = 0;
              }
            }
          }
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool Solver::check_invariants()
{
    TRACE(printf("c check solver invariants\n");)

    bool pass = true;
    bool fatal_on_watch_removed = false;

    /* ensure that each assigned literal has a proper reason clause as well */
    for (int i = 0; i < trail.size(); ++i) {
        Var v = var(trail[i]);
        int l = level(v);
        if (!(l == 0 || reason(v) != CRef_Undef || trail_lim[l - 1] == i)) {
            std::cout << "c trail literal " << trail[i] << " at level " << l << " (pos: " << i
                      << " has no proper reason clause" << std::endl;
            pass = false;
        }
    }

    // check whether clause is in solver in the right watch lists
    for (int p = 0; p < 4; ++p) {

        const vec<CRef> &clause_list = (p == 0 ? clauses : (p == 1 ? learnts_core : (p == 2 ? learnts_tier2 : learnts_local)));
        for (int i = 0; i < clause_list.size(); ++i) {
            const CRef cr = clause_list[i];
            const Clause &c = ca[cr];
            if (c.mark() == 1) {
                continue;
            }

            if (c.size() == 1) {
                std::cout << "c there should not be unit clauses! [" << cr << "]" << c << std::endl;
                pass = false;
            } else {
                if (c.size() > 2) {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                } else {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches_bin[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws.size(); ++k) {
                    CRef inner_cr = ws[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() <= 2) {
                    std::cout << "c found binary or smaller clause [" << wcr << "]" << c << " in watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
            vec<Watcher> &ws_bin = watches_bin[l];
            for (int j = 0; j < ws_bin.size(); ++j) {
                CRef wcr = ws_bin[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws_bin.size(); ++k) {
                    CRef inner_cr = ws_bin[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() != 2) {
                    std::cout << "c found non-binary clause [" << wcr << "]" << c << " in binary watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
        }
        if (seen[v] != 0) {
            std::cout << "c seen for variable " << v << " is not 0, but " << (int)seen[v] << std::endl;
            pass = false;
        }
    }

    for (int i = 0; i < old_trail.size(); ++i) {
        const Lit old_trail_top = old_trail[old_trail_qhead];
        const CRef old_reason = oldreasons[var(old_trail_top)];
        if (old_reason == CRef_Undef) continue;
        const Clause &c = ca[old_reason];
        assert((c.size() == 2 || c[0] == old_trail_top) && "assert literal has to be at first position");
        if (!(c.size() == 2 || c[0] == old_trail_top)) pass = false;
    }


    assert(pass && "some solver invariant check failed");
    return pass;
}